

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

Breakdown * __thiscall
absl::lts_20250127::Time::In(Breakdown *__return_storage_ptr__,Time *this,Time *param_3)

{
  int_least8_t *ct;
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  year_t yVar4;
  undefined8 extraout_RDX;
  Time TVar5;
  Duration DVar6;
  Duration d;
  civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> local_1a8;
  civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> local_198;
  weekday local_184;
  Duration local_180;
  HiRep local_170;
  uint local_168;
  HiRep local_160;
  uint local_158;
  HiRep local_154;
  uint32_t local_14c;
  undefined1 local_148 [8];
  civil_day cd;
  civil_second cs;
  time_zone local_120;
  undefined1 auStack_118 [8];
  absolute_lookup al;
  int64_t local_d8;
  duration<long,std::ratio<1l,1l>> local_d0 [8];
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
  local_c8;
  time_point<seconds> local_c0;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tp;
  HiRep local_98;
  Time *this_local;
  TimeZone tz_local;
  
  DVar6 = this->rep_;
  this_local = param_3;
  TVar5 = InfiniteFuture();
  bVar1 = lts_20250127::operator==((Time)DVar6,TVar5);
  if (bVar1) {
    anon_unknown_8::InfiniteFutureBreakdown();
  }
  else {
    DVar6 = this->rep_;
    TVar5 = InfinitePast();
    local_98 = TVar5.rep_.rep_hi_;
    tp.__d.__r = (duration)(duration)local_98;
    bVar1 = lts_20250127::operator==((Time)DVar6,TVar5);
    if (bVar1) {
      anon_unknown_8::InfinitePastBreakdown();
    }
    else {
      local_c8.__d.__r = (duration)anon_unknown_8::unix_epoch();
      al.abbr = *(char **)&(this->rep_).rep_hi_;
      DVar6.rep_hi_.hi_ = 0;
      DVar6.rep_hi_.lo_ = (this->rep_).rep_lo_;
      DVar6.rep_lo_ = (uint32_t)extraout_RDX;
      local_d8 = time_internal::GetRepHi((time_internal *)al.abbr,DVar6);
      std::chrono::duration<long,std::ratio<1l,1l>>::duration<long,void>(local_d0,&local_d8);
      local_c0.__d.__r =
           (duration)
           std::chrono::operator+(&local_c8,(duration<long,_std::ratio<1L,_1L>_> *)local_d0);
      local_120 = TimeZone::operator_cast_to_time_zone((TimeZone *)&this_local);
      time_internal::cctz::time_zone::lookup((absolute_lookup *)auStack_118,&local_120,&local_c0);
      cd.f_.m = auStack_118[0];
      cd.f_.d = auStack_118[1];
      cd.f_.hh = auStack_118[2];
      cd.f_.mm = auStack_118[3];
      cd.f_.ss = auStack_118[4];
      cd.f_._13_3_ = auStack_118._5_3_;
      ct = &cd.f_.m;
      time_internal::cctz::detail::
      civil_time<absl::lts_20250127::time_internal::cctz::detail::day_tag>::
      civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>
                ((civil_time<absl::lts_20250127::time_internal::cctz::detail::day_tag> *)local_148,
                 (civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> *)ct,
                 (preserves_data<absl::lts_20250127::time_internal::cctz::detail::second_tag,_absl::lts_20250127::time_internal::cctz::detail::day_tag>
                  *)0x0);
      Breakdown::Breakdown(__return_storage_ptr__);
      yVar4 = time_internal::cctz::detail::
              civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::year
                        ((civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> *)
                         ct);
      __return_storage_ptr__->year = yVar4;
      iVar2 = time_internal::cctz::detail::
              civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::month
                        ((civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> *)
                         ct);
      __return_storage_ptr__->month = iVar2;
      iVar2 = time_internal::cctz::detail::
              civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::day
                        ((civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> *)
                         ct);
      __return_storage_ptr__->day = iVar2;
      iVar2 = time_internal::cctz::detail::
              civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::hour
                        ((civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> *)
                         ct);
      __return_storage_ptr__->hour = iVar2;
      iVar2 = time_internal::cctz::detail::
              civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::minute
                        ((civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> *)
                         ct);
      __return_storage_ptr__->minute = iVar2;
      uVar3 = time_internal::cctz::detail::
              civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::second
                        ((civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag> *)
                         ct);
      __return_storage_ptr__->second = uVar3;
      local_168 = (this->rep_).rep_lo_;
      local_170 = (this->rep_).rep_hi_;
      d.rep_hi_.hi_ = 0;
      d.rep_hi_.lo_ = local_168;
      d.rep_lo_ = uVar3;
      local_160 = local_170;
      local_158 = local_168;
      uVar3 = time_internal::GetRepLo((time_internal *)local_170,d);
      local_180 = time_internal::MakeDuration(0,uVar3);
      local_154 = local_180.rep_hi_;
      local_14c = local_180.rep_lo_;
      (__return_storage_ptr__->subsecond).rep_hi_ = local_180.rep_hi_;
      (__return_storage_ptr__->subsecond).rep_lo_ = local_180.rep_lo_;
      time_internal::cctz::detail::
      civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::
      civil_time<absl::lts_20250127::time_internal::cctz::detail::day_tag>
                (&local_198,
                 (civil_time<absl::lts_20250127::time_internal::cctz::detail::day_tag> *)local_148,
                 (preserves_data<absl::lts_20250127::time_internal::cctz::detail::second_tag,_absl::lts_20250127::time_internal::cctz::detail::day_tag>
                  *)0x0);
      local_184 = time_internal::cctz::detail::get_weekday(&local_198);
      iVar2 = anon_unknown_8::MapWeekday(&local_184);
      __return_storage_ptr__->weekday = iVar2;
      time_internal::cctz::detail::
      civil_time<absl::lts_20250127::time_internal::cctz::detail::second_tag>::
      civil_time<absl::lts_20250127::time_internal::cctz::detail::day_tag>
                (&local_1a8,
                 (civil_time<absl::lts_20250127::time_internal::cctz::detail::day_tag> *)local_148,
                 (preserves_data<absl::lts_20250127::time_internal::cctz::detail::second_tag,_absl::lts_20250127::time_internal::cctz::detail::day_tag>
                  *)0x0);
      iVar2 = time_internal::cctz::detail::get_yearday(&local_1a8);
      __return_storage_ptr__->yearday = iVar2;
      __return_storage_ptr__->offset = al.cs.f_._8_4_;
      __return_storage_ptr__->is_dst = (bool)(al.cs.f_.ss & 1);
      __return_storage_ptr__->zone_abbr = (char *)al._16_8_;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ABSL_INTERNAL_DISABLE_DEPRECATED_DECLARATION_WARNING
absl::Time::Breakdown Time::In(absl::TimeZone tz) const {
  if (*this == absl::InfiniteFuture()) return InfiniteFutureBreakdown();
  if (*this == absl::InfinitePast()) return InfinitePastBreakdown();

  const auto tp = unix_epoch() + cctz::seconds(time_internal::GetRepHi(rep_));
  const auto al = cctz::time_zone(tz).lookup(tp);
  const auto cs = al.cs;
  const auto cd = cctz::civil_day(cs);

  absl::Time::Breakdown bd;
  bd.year = cs.year();
  bd.month = cs.month();
  bd.day = cs.day();
  bd.hour = cs.hour();
  bd.minute = cs.minute();
  bd.second = cs.second();
  bd.subsecond = time_internal::MakeDuration(0, time_internal::GetRepLo(rep_));
  bd.weekday = MapWeekday(cctz::get_weekday(cd));
  bd.yearday = cctz::get_yearday(cd);
  bd.offset = al.offset;
  bd.is_dst = al.is_dst;
  bd.zone_abbr = al.abbr;
  return bd;
}